

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  size_type sVar1;
  bool bVar2;
  CfgNode *local_8;
  
  if (node == (CfgNode *)0x0) {
    bVar2 = false;
  }
  else {
    local_8 = node;
    sVar1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::count
                      (&this->m_nodes,&local_8);
    bVar2 = sVar1 == 1;
  }
  return bVar2;
}

Assistant:

bool CFG::containsNode(CfgNode* node) const {
	return node ? (m_nodes.count(node) == 1) : false;
}